

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

GlContext *
sf::priv::GlContext::create(ContextSettings *settings,WindowImpl *owner,uint bitsPerPixel)

{
  GlContext *pGVar1;
  long in_RDI;
  GlContext *context;
  ContextSettings sharedSettings;
  Lock lock;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Mutex *in_stack_ffffffffffffff88;
  Lock *in_stack_ffffffffffffff90;
  GlContext *in_stack_ffffffffffffff98;
  GlContext *in_stack_ffffffffffffffa0;
  WindowImpl *owner_00;
  ContextSettings *in_stack_ffffffffffffffb0;
  GlxContext *in_stack_ffffffffffffffb8;
  GlxContext *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  ContextSettings *in_stack_ffffffffffffffd0;
  GlxContext *in_stack_ffffffffffffffd8;
  GlxContext *in_stack_ffffffffffffffe0;
  
  Lock::Lock(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if ((((anonymous_namespace)::GlContextImpl::resourceCount == 1) &&
      ((*(uint *)(in_RDI + 0x14) & 1) != 0)) &&
     ((((anonymous_namespace)::GlContextImpl::sharedContext->m_settings).attributeFlags & 1) == 0))
  {
    in_stack_ffffffffffffff80 = 0;
    ContextSettings::ContextSettings
              ((ContextSettings *)&stack0xffffffffffffffc4,0,0,0,*(uint *)(in_RDI + 0xc),
               *(uint *)(in_RDI + 0x10),*(uint *)(in_RDI + 0x14),false);
    in_stack_ffffffffffffffa0 = (anonymous_namespace)::GlContextImpl::sharedContext;
    if ((anonymous_namespace)::GlContextImpl::sharedContext != (GlContext *)0x0) {
      (*(anonymous_namespace)::GlContextImpl::sharedContext->_vptr_GlContext[1])();
    }
    pGVar1 = (GlContext *)operator_new(0x58);
    GlxContext::GlxContext
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    (anonymous_namespace)::GlContextImpl::sharedContext = pGVar1;
    in_stack_ffffffffffffff98 = (anonymous_namespace)::GlContextImpl::sharedContext;
    initialize(&in_stack_ffffffffffffffe0->super_GlContext,
               (ContextSettings *)in_stack_ffffffffffffffd8);
    anon_unknown.dwarf_24fcec::GlContextImpl::loadExtensions();
  }
  owner_00 = (WindowImpl *)0x0;
  setActive((GlContext *)0x0,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  pGVar1 = (GlContext *)operator_new(0x58);
  GlxContext::GlxContext
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,owner_00,
             (uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  setActive(pGVar1,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  initialize(&in_stack_ffffffffffffffe0->super_GlContext,
             (ContextSettings *)in_stack_ffffffffffffffd8);
  checkSettings(in_stack_ffffffffffffffa0,(ContextSettings *)in_stack_ffffffffffffff98);
  Lock::~Lock((Lock *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  return pGVar1;
}

Assistant:

GlContext* GlContext::create(const ContextSettings& settings, const WindowImpl* owner, unsigned int bitsPerPixel)
{
    using GlContextImpl::mutex;
    using GlContextImpl::resourceCount;
    using GlContextImpl::sharedContext;
    using GlContextImpl::loadExtensions;

    // Make sure that there's an active context (context creation may need extensions, and thus a valid context)
    assert(sharedContext != NULL);

    Lock lock(mutex);

    // If resourceCount is 1 we know that we are inside sf::Context or sf::Window
    // Only in this situation we allow the user to indirectly re-create the shared context as a core context

    // Check if we need to convert our shared context into a core context
    if ((resourceCount == 1) &&
        (settings.attributeFlags & ContextSettings::Core) &&
        !(sharedContext->m_settings.attributeFlags & ContextSettings::Core))
    {
        // Re-create our shared context as a core context
        ContextSettings sharedSettings(0, 0, 0, settings.majorVersion, settings.minorVersion, settings.attributeFlags);

        delete sharedContext;
        sharedContext = new ContextType(NULL, sharedSettings, 1, 1);
        sharedContext->initialize(sharedSettings);

        // Reload our extensions vector
        loadExtensions();
    }

    GlContext* context = NULL;

    // We don't use acquireTransientContext here since we have
    // to ensure we have exclusive access to the shared context
    // in order to make sure it is not active during context creation
    {
        sharedContext->setActive(true);

        // Create the context
        context = new ContextType(sharedContext, settings, owner, bitsPerPixel);

        sharedContext->setActive(false);
    }

    context->initialize(settings);
    context->checkSettings(settings);

    return context;
}